

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::collector::~collector(collector *this)

{
  vector<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
  *in_stack_00000010;
  
  std::
  vector<boost::shared_ptr<boost::unit_test::decorator::base>,_std::allocator<boost::shared_ptr<boost::unit_test::decorator::base>_>_>
  ::~vector(in_stack_00000010);
  return;
}

Assistant:

class BOOST_TEST_DECL collector : public singleton<collector> {
public:
    collector&              operator*( base const& d );

    void                    store_in( test_unit& tu );

    void                    reset();

private:
    BOOST_TEST_SINGLETON_CONS( collector )

    // Data members
    std::vector<base_ptr>   m_tu_decorators;
}